

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_locale.cpp
# Opt level: O1

bool ASCIICharToWide(char *sASCII,size_t sASCII_length,wchar_t *wASCII,size_t wASCII_capacity)

{
  wchar_t *pwVar1;
  wchar_t *pwVar2;
  int iVar3;
  wchar_t *pwVar4;
  bool bVar5;
  
  if ((sASCII != (char *)0x0) && ((wchar_t *)0x3f < wASCII && sASCII_length != 0)) {
    pwVar2 = (wchar_t *)0x40;
    pwVar1 = (wchar_t *)0x0;
    do {
      iVar3 = (int)sASCII[(long)pwVar1];
      bVar5 = false;
      if (-1 < iVar3) {
        bVar5 = sASCII[(long)pwVar1] != '\0';
        pwVar4 = pwVar1;
        if (!bVar5) {
          pwVar2 = (wchar_t *)((long)pwVar1 + 1);
          iVar3 = 0;
          pwVar4 = pwVar2;
        }
        *(int *)(sASCII_length + (long)pwVar1 * 4) = iVar3;
        pwVar1 = pwVar4;
      }
    } while ((bVar5) && (pwVar1 = (wchar_t *)((long)pwVar1 + 1), pwVar1 < pwVar2));
    if (pwVar2 <= pwVar1) {
      if (pwVar1 <= wASCII && (long)wASCII - (long)pwVar1 != 0) {
        memset((void *)(sASCII_length + (long)pwVar1 * 4),0,((long)wASCII - (long)pwVar1) * 4);
      }
      if (*(int *)((sASCII_length - 4) + (long)wASCII * 4) == 0) {
        return true;
      }
    }
  }
  if (wASCII != (wchar_t *)0x0 && sASCII_length != 0) {
    memset((void *)sASCII_length,0,(long)wASCII << 2);
  }
  return false;
}

Assistant:

static bool ASCIICharToWide(
  const char* sASCII,
  size_t sASCII_length,
  wchar_t* wASCII,
  size_t wASCII_capacity
  )
{
  for (;;)
  {
    if (nullptr == sASCII || sASCII_length <= 0)
      break;
    if (nullptr == wASCII || wASCII_capacity <= 0)
      break;
    if (wASCII_capacity < sASCII_length)
      break;

    size_t i;
    for (i = 0; i < sASCII_length; i++)
    {
      const char c = sASCII[i];
      if (c < 0 || c > 127)
        break;
      if (0 == c)
      {
        wASCII[i++] = 0;
        sASCII_length = i;
        break;
      }

      wASCII[i] = (wchar_t)c;
    }
    if ( i < sASCII_length )
      break;

    for(/*empty init*/;i < wASCII_capacity; i++)
      wASCII[i] = 0;

    if ( 0 != wASCII[wASCII_capacity-1])
      break;
    return true;
  }

  if ( nullptr != wASCII && wASCII_capacity > 0)
    memset(wASCII,0,wASCII_capacity*sizeof(wASCII[0]));

  return false;
}